

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O3

SrcTypeId __thiscall
Js::SerializationCloner<Js::StreamWriter>::GetTypeId
          (SerializationCloner<Js::StreamWriter> *this,Src src)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this_00;
  SrcTypeId SVar5;
  
  if (src == (Src)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00f0e014;
    *puVar4 = 0;
  }
  else {
    if (((ulong)src & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)src & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00f0e014;
      SVar5 = TypeIds_FirstNumberType;
      goto LAB_00f0dfe8;
    }
    if (((ulong)src & 0xffff000000000000) == 0x1000000000000) {
      return TypeIds_FirstNumberType;
    }
    if ((ulong)src >> 0x32 != 0) {
      return TypeIds_Number;
    }
  }
  this_00 = UnsafeVarTo<Js::RecyclableObject>(src);
  if (this_00 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00f0e014;
    *puVar4 = 0;
  }
  SVar5 = ((this_00->type).ptr)->typeId;
  if ((int)SVar5 < 0x58) {
    return SVar5;
  }
  BVar3 = RecyclableObject::IsExternal(this_00);
  if (BVar3 != 0) {
    return SVar5;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                              ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                              "GetTypeId aValue has invalid TypeId");
  if (bVar2) {
LAB_00f0dfe8:
    *puVar4 = 0;
    return SVar5;
  }
LAB_00f0e014:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

SrcTypeId GetTypeId(Src src) const
        {
            return JavascriptOperators::GetTypeId(src);
        }